

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

Options * __thiscall
ApprovalTests::Options::FileOptions::withFileExtension
          (Options *__return_storage_ptr__,FileOptions *this,string *fileExtensionWithDot)

{
  pointer pcVar1;
  int in_ECX;
  void *in_R8;
  FileOptions newSelf;
  uint *local_70;
  undefined8 local_68;
  uint local_60 [2];
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined8 local_50;
  uint *local_48;
  undefined8 local_40;
  uint local_38 [2];
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pcVar1 = (fileExtensionWithDot->_M_dataplus)._M_p;
  local_70 = local_60;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + fileExtensionWithDot->_M_string_length);
  local_50 = 0;
  if (local_70 == local_60) {
    uStack_30 = uStack_58;
    uStack_2c = uStack_54;
    local_48 = local_38;
  }
  else {
    local_48 = local_70;
  }
  local_40 = local_68;
  local_68 = 0;
  local_60[0] = local_60[0] & 0xffffff00;
  local_70 = local_60;
  Options::clone(__return_storage_ptr__,(__fn *)this->options_,&local_50,in_ECX,in_R8);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Options
    Options::FileOptions::withFileExtension(const std::string& fileExtensionWithDot) const
    {
        FileOptions newSelf(fileExtensionWithDot);
        return options_->clone(newSelf);
    }